

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclPlatform.cpp
# Opt level: O0

vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> * __thiscall
xmrig::OclPlatform::devices(OclPlatform *this)

{
  bool bVar1;
  cl_platform_id p_Var2;
  allocator_type *paVar3;
  cl_platform_id __args_2;
  OclPlatform *in_RSI;
  vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *in_RDI;
  size_t i;
  vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> devices;
  cl_uint num_devices;
  vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *out;
  cl_uint *in_stack_ffffffffffffff40;
  cl_device_id *in_stack_ffffffffffffff48;
  allocator_type *in_stack_ffffffffffffff50;
  cl_uint num_entries;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int iVar4;
  cl_platform_id in_stack_ffffffffffffff60;
  vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *this_00;
  allocator_type *local_58;
  vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> local_48;
  int local_2c;
  undefined4 local_28;
  byte local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::vector
            ((vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *)0x22194e);
  bVar1 = isValid(in_RSI);
  if (bVar1) {
    local_2c = 0;
    p_Var2 = id(in_RSI);
    OclLib::getDeviceIDs
              (in_stack_ffffffffffffff60,
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               (cl_uint)((ulong)in_stack_ffffffffffffff50 >> 0x20),in_stack_ffffffffffffff48,
               in_stack_ffffffffffffff40);
    if (local_2c == 0) {
      local_11 = 1;
      local_28 = 1;
    }
    else {
      std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::reserve
                (this_00,(size_type)p_Var2);
      std::allocator<_cl_device_id_*>::allocator((allocator<_cl_device_id_*> *)0x221a24);
      std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::vector
                ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)
                 in_stack_ffffffffffffff60,
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 in_stack_ffffffffffffff50);
      num_entries = (cl_uint)((ulong)in_stack_ffffffffffffff50 >> 0x20);
      std::allocator<_cl_device_id_*>::~allocator((allocator<_cl_device_id_*> *)0x221a47);
      p_Var2 = id(in_RSI);
      iVar4 = local_2c;
      std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::data
                ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)0x221a70);
      OclLib::getDeviceIDs
                (p_Var2,CONCAT44(iVar4,in_stack_ffffffffffffff58),num_entries,
                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      local_58 = (allocator_type *)0x0;
      while( true ) {
        in_stack_ffffffffffffff50 = local_58;
        paVar3 = (allocator_type *)
                 std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::size(&local_48);
        if (paVar3 <= in_stack_ffffffffffffff50) break;
        std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::operator[]
                  (&local_48,(size_type)local_58);
        __args_2 = id(in_RSI);
        std::vector<xmrig::OclDevice,std::allocator<xmrig::OclDevice>>::
        emplace_back<unsigned_long&,_cl_device_id*&,_cl_platform_id*>
                  ((vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *)p_Var2,
                   (unsigned_long *)CONCAT44(iVar4,in_stack_ffffffffffffff58),
                   (_cl_device_id **)in_stack_ffffffffffffff50,(_cl_platform_id **)__args_2);
        local_58 = local_58 + 1;
      }
      local_11 = 1;
      local_28 = 1;
      std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::~vector
                ((vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> *)
                 in_stack_ffffffffffffff50);
    }
  }
  else {
    local_11 = 1;
    local_28 = 1;
  }
  if ((local_11 & 1) == 0) {
    std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::~vector
              ((vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *)
               in_stack_ffffffffffffff50);
  }
  return in_RDI;
}

Assistant:

std::vector<xmrig::OclDevice> xmrig::OclPlatform::devices() const
{
    std::vector<OclDevice> out;
    if (!isValid()) {
        return out;
    }

    cl_uint num_devices = 0;
    OclLib::getDeviceIDs(id(), CL_DEVICE_TYPE_GPU, 0, nullptr, &num_devices);
    if (num_devices == 0) {
        return out;
    }

    out.reserve(num_devices);
    std::vector<cl_device_id> devices(num_devices);
    OclLib::getDeviceIDs(id(), CL_DEVICE_TYPE_GPU, num_devices, devices.data(), nullptr);

    for (size_t i = 0; i < devices.size(); ++i) {
        out.emplace_back(i, devices[i], id());
    }

    return out;
}